

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

sat_solver * Gia_ManDeriveSatSolver(Gia_Man_t *p,Vec_Int_t *vSatIds)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  Aig_Obj_t *pObj_00;
  sat_solver *psVar4;
  int local_3c;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  Aig_Man_t *pAig;
  sat_solver *pSat;
  Vec_Int_t *vSatIds_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManToAigSimple(p);
  iVar2 = Aig_ManCoNum(p_00);
  p_01 = Cnf_Derive(p_00,iVar2);
  if (vSatIds != (Vec_Int_t *)0x0) {
    Vec_IntClear(vSatIds);
    for (local_3c = 0; iVar2 = Vec_PtrSize(p_00->vCis), local_3c < iVar2; local_3c = local_3c + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vCis,local_3c);
      piVar1 = p_01->pVarNums;
      iVar2 = Aig_ObjId(pObj_00);
      Vec_IntPush(vSatIds,piVar1[iVar2]);
    }
    iVar2 = Vec_IntSize(vSatIds);
    iVar3 = Gia_ManPiNum(p);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntSize(vSatIds) == Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcChain.c"
                    ,200,"sat_solver *Gia_ManDeriveSatSolver(Gia_Man_t *, Vec_Int_t *)");
    }
  }
  Aig_ManStop(p_00);
  psVar4 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  Cnf_DataFree(p_01);
  if (p->nRegs == 0) {
    return psVar4;
  }
  __assert_fail("p->nRegs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcChain.c"
                ,0xcd,"sat_solver *Gia_ManDeriveSatSolver(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

sat_solver * Gia_ManDeriveSatSolver( Gia_Man_t * p, Vec_Int_t * vSatIds )
{
//    extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    sat_solver * pSat;
    Aig_Man_t * pAig = Gia_ManToAigSimple( p );
//    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    Cnf_Dat_t * pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    // save SAT vars for the primary inputs
    if ( vSatIds )
    {
        Aig_Obj_t * pObj; int i;
        Vec_IntClear( vSatIds );
        Aig_ManForEachCi( pAig, pObj, i )
            Vec_IntPush( vSatIds, pCnf->pVarNums[ Aig_ObjId(pObj) ] );
        assert( Vec_IntSize(vSatIds) == Gia_ManPiNum(p) );
    }
    Aig_ManStop( pAig );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Cnf_DataFree( pCnf );
    assert( p->nRegs == 0 );
    return pSat;
}